

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<const_char_*,_8UL>::SmallVector(SmallVector<const_char_*,_8UL> *this)

{
  char **ppcVar1;
  SmallVector<const_char_*,_8UL> *this_local;
  
  VectorView<const_char_*>::VectorView(&this->super_VectorView<const_char_*>);
  this->buffer_capacity = 0;
  ppcVar1 = AlignedBuffer<const_char_*,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<const_char_*>).ptr = ppcVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}